

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdiff.c
# Opt level: O0

int64_t search(int64_t *I,uint8_t *old,int64_t oldsize,uint8_t *new,int64_t newsize,int64_t st,
              int64_t en,int64_t *pos)

{
  int iVar1;
  int64_t *piVar2;
  long en_00;
  size_t local_70;
  int64_t y;
  int64_t x;
  int64_t st_local;
  int64_t newsize_local;
  uint8_t *new_local;
  int64_t oldsize_local;
  uint8_t *old_local;
  int64_t *I_local;
  
  if (en - st < 2) {
    piVar2 = (int64_t *)matchlen(old + I[st],oldsize - I[st],new,newsize);
    I_local = (int64_t *)matchlen(old + I[en],oldsize - I[en],new,newsize);
    if ((long)I_local < (long)piVar2) {
      *pos = I[st];
      I_local = piVar2;
    }
    else {
      *pos = I[en];
    }
  }
  else {
    en_00 = st + (en - st) / 2;
    local_70 = newsize;
    if (oldsize - I[en_00] < newsize) {
      local_70 = oldsize - I[en_00];
    }
    iVar1 = memcmp(old + I[en_00],new,local_70);
    if (iVar1 < 0) {
      I_local = (int64_t *)search(I,old,oldsize,new,newsize,en_00,en,pos);
    }
    else {
      I_local = (int64_t *)search(I,old,oldsize,new,newsize,st,en_00,pos);
    }
  }
  return (int64_t)I_local;
}

Assistant:

static int64_t search(const int64_t *I,const uint8_t *old,int64_t oldsize,
		const uint8_t *new,int64_t newsize,int64_t st,int64_t en,int64_t *pos)
{
	int64_t x,y;

	if(en-st<2) {
		x=matchlen(old+I[st],oldsize-I[st],new,newsize);
		y=matchlen(old+I[en],oldsize-I[en],new,newsize);

		if(x>y) {
			*pos=I[st];
			return x;
		} else {
			*pos=I[en];
			return y;
		}
	};

	x=st+(en-st)/2;
	if(memcmp(old+I[x],new,MIN(oldsize-I[x],newsize))<0) {
		return search(I,old,oldsize,new,newsize,x,en,pos);
	} else {
		return search(I,old,oldsize,new,newsize,st,x,pos);
	};
}